

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  XXH64_state_t *state_in;
  long lVar1;
  byte bVar2;
  void *pvVar3;
  undefined1 *puVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  ZSTD_ErrorCode ZVar8;
  size_t sVar9;
  XXH64_state_t *pXVar10;
  XXH64_hash_t XVar11;
  char cVar12;
  XXH64_state_t *pXVar13;
  undefined1 *puVar14;
  XXH64_state_t *pXVar15;
  XXH64_state_t *pXVar16;
  uint *puVar17;
  uint *puVar18;
  XXH64_state_t *__n;
  undefined1 *puVar19;
  void *local_a8;
  void *local_98;
  void *local_48;
  blockProperties_t local_3c;
  
  local_48 = dict;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_48 = ZSTD_DDict_dictContent(ddict);
    dictSize = ZSTD_DDict_dictSize(ddict);
  }
  state_in = &dctx->xxhState;
  bVar6 = 0;
  pXVar16 = state_in;
  local_98 = dst;
  do {
    do {
      if (srcSize < (undefined1 *)0x5) {
        if ((undefined1 *)srcSize != (undefined1 *)0x0) {
          return 0xffffffffffffffb8;
        }
        return (long)local_98 - (long)dst;
      }
      iVar7 = 0;
      pXVar13 = pXVar16;
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        pXVar13 = (XXH64_state_t *)0xffffffffffffffb8;
        if ((undefined1 *)0x7 < srcSize) {
          pXVar13 = (XXH64_state_t *)0xfffffffffffffff2;
          if ((*(uint *)((long)src + 4) >> 3 < 0x1fffffff) &&
             (pXVar13 = (XXH64_state_t *)((ulong)*(uint *)((long)src + 4) + 8), srcSize < pXVar13))
          {
            pXVar13 = (XXH64_state_t *)0xffffffffffffffb8;
          }
        }
        iVar7 = 1;
        if (pXVar13 < (XXH64_state_t *)0xffffffffffffff89) {
          src = (void *)((long)src + (long)pXVar13);
          srcSize = srcSize + -(long)pXVar13;
          iVar7 = 2;
          pXVar13 = pXVar16;
        }
      }
      pXVar16 = pXVar13;
    } while (iVar7 == 2);
    if (iVar7 != 0) {
      return (size_t)pXVar13;
    }
    if (ddict == (ZSTD_DDict *)0x0) {
      sVar9 = ZSTD_decompressBegin_usingDict(dctx,local_48,dictSize);
      if (0xffffffffffffff88 < sVar9) {
        return sVar9;
      }
    }
    else {
      ZSTD_decompressBegin_usingDDict(dctx,ddict);
    }
    pvVar3 = dctx->previousDstEnd;
    if (pvVar3 != local_98) {
      dctx->dictEnd = pvVar3;
      dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar3) + (long)local_98);
      dctx->prefixStart = local_98;
      dctx->previousDstEnd = local_98;
    }
    puVar17 = (uint *)src;
    puVar19 = (undefined1 *)srcSize;
    if (srcSize < (undefined1 *)0x9) {
      pXVar16 = (XXH64_state_t *)0xffffffffffffffb8;
    }
    else {
      bVar2 = (byte)*(uint *)((long)src + 4);
      lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
              *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
              (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5));
      pXVar15 = (XXH64_state_t *)(lVar1 + 5);
      pXVar16 = pXVar15;
      puVar14 = (undefined1 *)srcSize;
      puVar18 = (uint *)src;
      if (pXVar15 < (XXH64_state_t *)0xffffffffffffff89) {
        if (srcSize < (undefined1 *)(lVar1 + 8U)) {
          pXVar16 = (XXH64_state_t *)0xffffffffffffffb8;
          goto LAB_0014bdef;
        }
        pXVar16 = (XXH64_state_t *)ZSTD_decodeFrameHeader(dctx,src,(size_t)pXVar15);
        bVar5 = pXVar16 < (XXH64_state_t *)0xffffffffffffff89;
        if (bVar5) {
          puVar14 = (undefined1 *)(srcSize + -(long)pXVar15);
          puVar18 = (uint *)((long)src + (long)pXVar15);
        }
      }
      else {
LAB_0014bdef:
        bVar5 = false;
      }
      if (bVar5) {
        local_a8 = local_98;
        do {
          pXVar10 = (XXH64_state_t *)ZSTD_getcBlockSize(puVar18,(size_t)puVar14,&local_3c);
          cVar12 = '\x01';
          pXVar15 = pXVar10;
          if (pXVar10 < (XXH64_state_t *)0xffffffffffffff89) {
            puVar18 = (uint *)((long)puVar18 + 3);
            puVar14 = puVar14 + -3;
            if (puVar14 < pXVar10) {
              pXVar15 = (XXH64_state_t *)0xffffffffffffffb8;
            }
            else {
              if (local_3c.blockType == bt_raw) {
                if (local_a8 == (void *)0x0) {
                  pXVar15 = (XXH64_state_t *)0xffffffffffffffb6;
                  if (pXVar10 == (XXH64_state_t *)0x0) {
                    pXVar15 = pXVar10;
                  }
                }
                else {
                  pXVar15 = (XXH64_state_t *)0xffffffffffffffba;
                  if (pXVar10 <= (undefined1 *)((long)local_98 + (dstCapacity - (long)local_a8))) {
                    memcpy(local_a8,puVar18,(size_t)pXVar10);
                    pXVar15 = pXVar10;
                  }
                }
              }
              else if (local_3c.blockType == bt_rle) {
                __n = (XXH64_state_t *)(ulong)local_3c.origSize;
                if (local_a8 == (void *)0x0) {
                  pXVar15 = __n;
                  if (__n != (XXH64_state_t *)0x0) {
                    pXVar15 = (XXH64_state_t *)0xffffffffffffffb6;
                  }
                }
                else {
                  pXVar15 = (XXH64_state_t *)0xffffffffffffffba;
                  if (__n <= (undefined1 *)((long)local_98 + (dstCapacity - (long)local_a8))) {
                    memset(local_a8,(uint)*(byte *)puVar18,(size_t)__n);
                    pXVar15 = __n;
                  }
                }
              }
              else {
                if (local_3c.blockType != bt_compressed) {
                  pXVar15 = (XXH64_state_t *)0xffffffffffffffec;
                  goto LAB_0014bea4;
                }
                pXVar15 = (XXH64_state_t *)
                          ZSTD_decompressBlock_internal
                                    (dctx,local_a8,(long)local_98 + (dstCapacity - (long)local_a8),
                                     puVar18,(size_t)pXVar10,1);
              }
              cVar12 = '\x01';
              if (pXVar15 < (XXH64_state_t *)0xffffffffffffff89) {
                if ((dctx->fParams).checksumFlag != 0) {
                  XXH64_update(state_in,local_a8,(size_t)pXVar15);
                }
                local_a8 = (void *)((long)local_a8 + (long)pXVar15);
                puVar18 = (uint *)((long)puVar18 + (long)pXVar10);
                cVar12 = (local_3c.lastBlock != 0) * '\x05';
                puVar14 = puVar14 + -(long)pXVar10;
                pXVar15 = pXVar16;
              }
            }
          }
LAB_0014bea4:
          pXVar16 = pXVar15;
        } while (cVar12 == '\0');
        if (cVar12 == '\x05') {
          puVar4 = (undefined1 *)(dctx->fParams).frameContentSize;
          pXVar10 = (XXH64_state_t *)((long)local_a8 - (long)local_98);
          if ((puVar4 == (undefined1 *)0xffffffffffffffff) || (pXVar10 == (XXH64_state_t *)puVar4))
          {
            pXVar16 = pXVar10;
            puVar17 = puVar18;
            puVar19 = puVar14;
            if ((dctx->fParams).checksumFlag != 0) {
              XVar11 = XXH64_digest(state_in);
              pXVar16 = (XXH64_state_t *)0xffffffffffffffea;
              if (puVar14 < (undefined1 *)0x4) {
                bVar5 = false;
              }
              else if (*puVar18 == (uint)XVar11) {
                puVar18 = puVar18 + 1;
                puVar14 = puVar14 + -4;
                bVar5 = true;
                pXVar16 = pXVar15;
              }
              else {
                bVar5 = false;
              }
              puVar17 = (uint *)src;
              puVar19 = (undefined1 *)srcSize;
              if (bVar5) {
                pXVar16 = pXVar10;
                puVar17 = puVar18;
                puVar19 = puVar14;
              }
            }
          }
          else {
            pXVar16 = (XXH64_state_t *)0xffffffffffffffec;
          }
        }
      }
    }
    ZVar8 = ZSTD_getErrorCode((size_t)pXVar16);
    if ((bool)(bVar6 & ZVar8 == ZSTD_error_prefix_unknown)) {
      pXVar16 = (XXH64_state_t *)0xffffffffffffffb8;
LAB_0014c0dc:
      pXVar13 = pXVar16;
      bVar5 = false;
    }
    else {
      if ((XXH64_state_t *)0xffffffffffffff88 < pXVar16) goto LAB_0014c0dc;
      local_98 = (void *)((long)local_98 + (long)pXVar16);
      dstCapacity = dstCapacity - (long)pXVar16;
      bVar5 = true;
    }
    bVar6 = 1;
    pXVar16 = pXVar13;
    src = puVar17;
    srcSize = (size_t)puVar19;
    if (!bVar5) {
      return (size_t)pXVar13;
    }
  } while( true );
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize);
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "at least one frame successfully completed, but following "
                "bytes are garbage: it's more likely to be a srcSize error, "
                "specifying more bytes than compressed size of frame(s). This "
                "error message replaces ERROR(prefix_unknown), which would be "
                "confusing, as the first header is actually correct. Note that "
                "one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic "
                "bytes. But this is _much_ less likely than a srcSize field "
                "error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (BYTE*)dst - (BYTE*)dststart;
}